

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::OutputRows
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,char *buffer,int strLen)

{
  FILE **ppFVar1;
  FILE *__stream;
  bool bVar2;
  int iVar3;
  reference piVar4;
  int *piVar5;
  char *pcVar6;
  uint local_48;
  int counter;
  int num;
  char *bufPtr;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  const_iterator it;
  int strLen_local;
  char *buffer_local;
  vector<int,_std::allocator<int>_> *fileIDs_local;
  aggreports *this_local;
  
  it._M_current._4_4_ = strLen;
  local_30._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(fileIDs);
  do {
    bufPtr = (char *)std::vector<int,_std::allocator<int>_>::end(fileIDs);
    bVar2 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &bufPtr);
    if (!bVar2) {
      return;
    }
    local_48 = 0;
    _counter = buffer;
    while( true ) {
      ppFVar1 = this->fout_;
      piVar4 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_30);
      iVar3 = fprintf((FILE *)ppFVar1[*piVar4],"%s",_counter);
      __stream = _stderr;
      if (iVar3 < 0) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        fprintf(__stream,"FATAL: Error writing %s: %s\n",buffer,pcVar6);
        exit(1);
      }
      if (it._M_current._4_4_ <= iVar3) break;
      _counter = _counter + iVar3;
      it._M_current._4_4_ = it._M_current._4_4_ - iVar3;
      local_48 = local_48 + 1;
      fprintf(_stderr,"INFO: Attempt %d to write %s\n",(ulong)local_48,buffer);
      if (local_48 == 10) {
        fprintf(_stderr,"FATAL: Maximum attempts to write %s exceeded\n",buffer);
        exit(1);
      }
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_30);
  } while( true );
}

Assistant:

inline void aggreports::OutputRows(const std::vector<int> &fileIDs,
				   const char * buffer, int strLen) {

  for (std::vector<int>::const_iterator it = fileIDs.begin();
       it != fileIDs.end(); ++it) {

    const char * bufPtr = buffer;
    int num;
    int counter = 0;
    do {

      num = fprintf(fout_[*it], "%s", bufPtr);
      if (num < 0) {   // Write error
	fprintf(stderr, "FATAL: Error writing %s: %s\n",
		buffer, strerror(errno));
	exit(EXIT_FAILURE);
      } else if (num < strLen) {   // Incomplete write
	bufPtr += num;
	strLen -= num;
      } else break;   // Success

      fprintf(stderr, "INFO: Attempt %d to write %s\n", ++counter, buffer);

      if (counter == 10) {
	fprintf(stderr, "FATAL: Maximum attempts to write %s exceeded\n",
		buffer);
	exit(EXIT_FAILURE);
      }

    } while (true);

  }

}